

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O0

BrotliDecoderResult
BrotliDecoderDecompress
          (size_t encoded_size,uint8_t *encoded_buffer,size_t *decoded_size,uint8_t *decoded_buffer)

{
  uint8_t *local_1480;
  uint8_t *next_out;
  size_t available_out;
  uint8_t *next_in;
  size_t available_in;
  size_t total_out;
  undefined1 local_1450 [4];
  BrotliDecoderResult result;
  BrotliDecoderStateInternal s;
  uint8_t *decoded_buffer_local;
  size_t *decoded_size_local;
  uint8_t *encoded_buffer_local;
  size_t encoded_size_local;
  
  available_in = 0;
  next_out = (uint8_t *)*decoded_size;
  local_1480 = decoded_buffer;
  available_out = (size_t)encoded_buffer;
  next_in = (uint8_t *)encoded_size;
  s.trivial_literal_contexts._24_8_ = decoded_buffer;
  BrotliDecoderStateInit((BrotliDecoderStateInternal *)local_1450);
  total_out._4_4_ =
       BrotliDecoderDecompressStream
                 ((BrotliDecoderStateInternal *)local_1450,(size_t *)&next_in,
                  (uint8_t **)&available_out,(size_t *)&next_out,&local_1480,&available_in);
  *decoded_size = available_in;
  BrotliDecoderStateCleanup((BrotliDecoderStateInternal *)local_1450);
  if (total_out._4_4_ != BROTLI_DECODER_RESULT_SUCCESS) {
    total_out._4_4_ = BROTLI_DECODER_RESULT_ERROR;
  }
  return total_out._4_4_;
}

Assistant:

BrotliDecoderResult BrotliDecoderDecompress(
    size_t encoded_size, const uint8_t* encoded_buffer, size_t* decoded_size,
    uint8_t* decoded_buffer) {
  BrotliDecoderState s;
  BrotliDecoderResult result;
  size_t total_out = 0;
  size_t available_in = encoded_size;
  const uint8_t* next_in = encoded_buffer;
  size_t available_out = *decoded_size;
  uint8_t* next_out = decoded_buffer;
  BrotliDecoderStateInit(&s);
  result = BrotliDecoderDecompressStream(
      &s, &available_in, &next_in, &available_out, &next_out, &total_out);
  *decoded_size = total_out;
  BrotliDecoderStateCleanup(&s);
  if (result != BROTLI_DECODER_RESULT_SUCCESS) {
    result = BROTLI_DECODER_RESULT_ERROR;
  }
  return result;
}